

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_intersect.cpp
# Opt level: O0

bool ON_Intersect(ON_Line *lineA,ON_Line *lineB,double *lineA_parameter,double *lineB_parameter)

{
  byte bVar1;
  bool bVar2;
  ON_3dPoint *this;
  ON_3dPoint *p;
  double *pdVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dB;
  double dA;
  ON_3dPoint qB;
  ON_3dPoint qA;
  double d;
  ON_3dPoint pB;
  ON_3dPoint pA;
  undefined1 local_108 [8];
  ON_Matrix M;
  ON_3dVector C;
  ON_3dVector B;
  ON_3dVector A;
  double Y [2];
  double X [2];
  double local_50;
  double pivot;
  double pr_tolerance;
  int rank;
  int i;
  double M_zero_tol;
  double *pdStack_28;
  bool rc;
  double *lineB_parameter_local;
  double *lineA_parameter_local;
  ON_Line *lineB_local;
  ON_Line *lineA_local;
  
  M_zero_tol._7_1_ = 0;
  _rank = 0.0;
  pdVar3 = &B.z;
  pdStack_28 = lineB_parameter;
  lineB_parameter_local = lineA_parameter;
  lineA_parameter_local = (double *)lineB;
  lineB_local = lineA;
  ON_Line::Direction((ON_3dVector *)pdVar3,lineA);
  ON_Line::Direction((ON_3dVector *)&C.z,(ON_Line *)lineA_parameter_local);
  this = ON_Line::operator[]((ON_Line *)lineA_parameter_local,0);
  p = ON_Line::operator[](lineB_local,0);
  ON_3dPoint::operator-((ON_3dVector *)&M.m_cmem,this,p);
  ON_Matrix::ON_Matrix((ON_Matrix *)local_108,2,2);
  dVar4 = ON_DotProduct((ON_3dVector *)pdVar3,(ON_3dVector *)pdVar3);
  pdVar3 = ON_Matrix::operator[]((ON_Matrix *)local_108,0);
  *pdVar3 = dVar4;
  dVar4 = ON_DotProduct((ON_3dVector *)&C.z,(ON_3dVector *)&C.z);
  pdVar3 = ON_Matrix::operator[]((ON_Matrix *)local_108,1);
  pdVar3[1] = dVar4;
  dVar4 = ON_DotProduct((ON_3dVector *)&B.z,(ON_3dVector *)&C.z);
  pdVar3 = ON_Matrix::operator[]((ON_Matrix *)local_108,1);
  *pdVar3 = -dVar4;
  pdVar3 = ON_Matrix::operator[]((ON_Matrix *)local_108,0);
  pdVar3[1] = -dVar4;
  pdVar3 = ON_Matrix::operator[]((ON_Matrix *)local_108,0);
  dVar4 = *pdVar3;
  pdVar3 = ON_Matrix::operator[]((ON_Matrix *)local_108,1);
  dVar5 = pdVar3[1];
  if (dVar4 < dVar5) {
    ON_Matrix::SwapCols((ON_Matrix *)local_108,0,1);
  }
  pr_tolerance._4_4_ = (uint)(dVar4 < dVar5);
  pdVar3 = ON_Matrix::operator[]((ON_Matrix *)local_108,1);
  if (ABS(pdVar3[1]) <= 1.0) {
    pivot = 1.490116119385e-08;
    _rank = 2.220446049250313e-16;
  }
  else {
    pdVar3 = ON_Matrix::operator[]((ON_Matrix *)local_108,1);
    pivot = ABS(pdVar3[1]) * 1.490116119385e-08;
    pdVar3 = ON_Matrix::operator[]((ON_Matrix *)local_108,1);
    _rank = ABS(pdVar3[1]) * 2.220446049250313e-16;
  }
  A.z = ON_DotProduct((ON_3dVector *)&B.z,(ON_3dVector *)&M.m_cmem);
  dVar4 = ON_DotProduct((ON_3dVector *)&C.z,(ON_3dVector *)&M.m_cmem);
  Y[0] = -dVar4;
  pr_tolerance._0_4_ = ON_Matrix::RowReduce((ON_Matrix *)local_108,_rank,&A.z,&local_50);
  if (pr_tolerance._0_4_ == 2) {
    M_zero_tol._7_1_ = 1;
    bVar2 = ON_3dPoint::operator==(&lineB_local->from,(ON_3dPoint *)lineA_parameter_local);
    if (bVar2) {
      if (lineB_parameter_local != (double *)0x0) {
        *lineB_parameter_local = 0.0;
      }
      if (pdStack_28 != (double *)0x0) {
        *pdStack_28 = 0.0;
      }
    }
    else {
      bVar2 = ON_3dPoint::operator==(&lineB_local->from,(ON_3dPoint *)(lineA_parameter_local + 3));
      if (bVar2) {
        if (lineB_parameter_local != (double *)0x0) {
          *lineB_parameter_local = 0.0;
        }
        if (pdStack_28 != (double *)0x0) {
          *pdStack_28 = 1.0;
        }
      }
      else {
        bVar2 = ON_3dPoint::operator==(&lineB_local->to,(ON_3dPoint *)lineA_parameter_local);
        if (bVar2) {
          if (lineB_parameter_local != (double *)0x0) {
            *lineB_parameter_local = 1.0;
          }
          if (pdStack_28 != (double *)0x0) {
            *pdStack_28 = 0.0;
          }
        }
        else {
          bVar2 = ON_3dPoint::operator==(&lineB_local->to,(ON_3dPoint *)(lineA_parameter_local + 3))
          ;
          if (bVar2) {
            if (lineB_parameter_local != (double *)0x0) {
              *lineB_parameter_local = 1.0;
            }
            if (pdStack_28 != (double *)0x0) {
              *pdStack_28 = 1.0;
            }
          }
          else {
            M_zero_tol._7_1_ = ON_Matrix::BackSolve((ON_Matrix *)local_108,0.0,2,&A.z,Y + 1);
            if ((bool)M_zero_tol._7_1_) {
              if (lineB_parameter_local != (double *)0x0) {
                *lineB_parameter_local = Y[(long)(int)pr_tolerance._4_4_ + 1];
              }
              if (pdStack_28 != (double *)0x0) {
                *pdStack_28 = Y[(long)(int)(1 - pr_tolerance._4_4_) + 1];
              }
              if (ABS(local_50) <= pivot) {
                ON_Line::PointAt((ON_3dPoint *)&pB.z,lineB_local,
                                 Y[(long)(int)pr_tolerance._4_4_ + 1]);
                ON_Line::PointAt((ON_3dPoint *)&d,(ON_Line *)lineA_parameter_local,
                                 Y[(long)(int)(1 - pr_tolerance._4_4_) + 1]);
                dVar4 = ON_3dPoint::DistanceTo((ON_3dPoint *)&pB.z,(ON_3dPoint *)&d);
                if ((pivot < dVar4) && (2.3283064365386963e-10 < dVar4)) {
                  ON_Line::ClosestPointTo((ON_3dPoint *)&qB.z,lineB_local,(ON_3dPoint *)&d);
                  ON_Line::ClosestPointTo
                            ((ON_3dPoint *)&dA,(ON_Line *)lineA_parameter_local,(ON_3dPoint *)&pB.z)
                  ;
                  dVar5 = ON_3dPoint::DistanceTo((ON_3dPoint *)&pB.z,(ON_3dPoint *)&dA);
                  dVar6 = ON_3dPoint::DistanceTo((ON_3dPoint *)&d,(ON_3dPoint *)&qB.z);
                  if (dVar4 <= dVar5 * 1.1) {
                    if (dVar6 * 1.1 < dVar4) {
                      M_zero_tol._7_1_ = 0;
                    }
                  }
                  else {
                    M_zero_tol._7_1_ = 0;
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  bVar1 = M_zero_tol._7_1_;
  ON_Matrix::~ON_Matrix((ON_Matrix *)local_108);
  return (bool)(bVar1 & 1);
}

Assistant:

bool ON_Intersect( const ON_Line& lineA, const ON_Line& lineB, 
                double* lineA_parameter, 
                double* lineB_parameter
                )
{
  // If you are looking at this code because you don't like an
  // answer you are getting, then the first thing to try is
  // to read the header file comments and try calling 
  // ON_IntersectLineLine.
  bool rc = false;
  double M_zero_tol = 0.0;
  int i, rank;
  double pr_tolerance, pivot, X[2], Y[2];

  ON_3dVector A = lineA.Direction();
  ON_3dVector B = lineB.Direction();
  ON_3dVector C = lineB[0] - lineA[0];
  
  ON_Matrix M(2,2);
  M[0][0] =  ON_DotProduct( A, A );
  M[1][1] =  ON_DotProduct( B, B );
  M[0][1] = M[1][0] = -ON_DotProduct( A, B );

  // this swap done to get row+col pivot accuracy
  if ( M[0][0] < M[1][1] ) {
    M.SwapCols(0,1);
    i = 1;
  }
  else {
    i = 0;
  }
  // 2021-07-21, Pierre, RH-65014
  // It does not make much sense to use a tolerance lower than ON_EPSILON on the
  // result of arithmetic on doubles. If M[1][1] is smaller than 1, we need to
  // bound M_zero_tol to ON_EPSILON or ON_Intersect will wrongly return true on
  // many near-parallel cases. pr_tolerance also needs to be bounded as it
  // cannot be smaller than M_zero_tolerance.
  //
  // Before that change, lines
  // Line A = (5.4301839655138417, -9.5, 0, -0.6, -9.5, 0)
  // Line B = (5.2373595635311068, 10.5, 0, 5.6603292194932395, 10.5, 0)
  // would be found as intersecting, with pivot ~= 2 * M_zero_tolerance
  if (fabs(M[1][1]) > 1.) {
    pr_tolerance = fabs(M[1][1]) * ON_SQRT_EPSILON;
    M_zero_tol = fabs(M[1][1]) * ON_EPSILON;
  } else {
    pr_tolerance = ON_SQRT_EPSILON;
    M_zero_tol = ON_EPSILON;
  }

  Y[0] =  ON_DotProduct( A, C );
  Y[1] = -ON_DotProduct( B, C );

  rank = M.RowReduce( M_zero_tol, Y, &pivot );
  if ( rank == 2 ) 
  {
    // 19 November 2003 Dale Lear and Chuck
    //   Added lineA.from/to == lineB.from/to tests
    //   so exact answer gets returned when people
    //   expect it.
    rc = true;
    if ( lineA.from == lineB.from )
    {
      if ( lineA_parameter )
        *lineA_parameter = 0.0;
      if ( lineB_parameter )
        *lineB_parameter = 0.0;
    }
    else if ( lineA.from == lineB.to )
    {
      if ( lineA_parameter )
        *lineA_parameter = 0.0;
      if ( lineB_parameter )
        *lineB_parameter = 1.0;
    }
    else if ( lineA.to == lineB.from )
    {
      if ( lineA_parameter )
        *lineA_parameter = 1.0;
      if ( lineB_parameter )
        *lineB_parameter = 0.0;
    }
    else if ( lineA.to == lineB.to )
    {
      if ( lineA_parameter )
        *lineA_parameter = 1.0;
      if ( lineB_parameter )
        *lineB_parameter = 1.0;
    }
    else
    {
      rc = M.BackSolve( 0.0, 2, Y, X );
      if ( rc ) 
      {
        if ( lineA_parameter )
          *lineA_parameter = X[i];
        if ( lineB_parameter )
          *lineB_parameter = X[1-i];
        if ( fabs(pivot) <= pr_tolerance ) 
        {
          // test answer because matrix was close to singular
          // (This test is slow but it is rarely used.)
          ON_3dPoint pA = lineA.PointAt(X[i]);
          ON_3dPoint pB = lineB.PointAt(X[1-i]);
          double d = pA.DistanceTo(pB);
          if ( d > pr_tolerance && d > ON_ZERO_TOLERANCE ) { 
            ON_3dPoint qA = lineA.ClosestPointTo(pB);
            ON_3dPoint qB = lineB.ClosestPointTo(pA);
            double dA = pA.DistanceTo(qB);
            double dB = pB.DistanceTo(qA);
            if ( 1.1*dA < d ) {
              rc = false;
            }
            else if ( 1.1*dB < d ) {
              rc = false;
            }
          }
        }
      }
    }
  }
  
  return rc;
}